

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O1

void print<ft::queue<int,ft::list<int,ft::allocator<int>>>>
               (queue<int,_ft::list<int,_ft::allocator<int>_>_> *t,char *s)

{
  size_type *psVar1;
  node *pnVar2;
  listNode<int> *plVar3;
  listNode<int> *plVar4;
  long lVar5;
  size_t sVar6;
  ostream *this;
  char local_29;
  
  lVar5 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar5 + -0x18) + 0x10c098);
  }
  else {
    sVar6 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  if ((t->c).m_size != 0) {
    do {
      local_29 = ' ';
      this = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
      std::ostream::operator<<(this,((t->c).m_head)->next->data);
      pnVar2 = (t->c).m_head;
      plVar3 = pnVar2->next;
      plVar4 = plVar3->next;
      pnVar2->next = plVar4;
      plVar4->prev = pnVar2;
      operator_delete(plVar3);
      psVar1 = &(t->c).m_size;
      *psVar1 = *psVar1 - 1;
    } while (*psVar1 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.front();
		t.pop();
	}
	std::cout << std::endl;
}